

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

word Abc_SopToTruth(char *pSop,int nInputs)

{
  int iVar1;
  int local_30;
  int nVars;
  int lit;
  int v;
  word Result;
  word Cube;
  int nInputs_local;
  char *pSop_local;
  
  _lit = 0;
  local_30 = 0;
  iVar1 = Abc_SopGetVarNum(pSop);
  if ((iVar1 < 0) || (6 < iVar1)) {
    __assert_fail("nVars >= 0 && nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                  ,0x49a,"word Abc_SopToTruth(char *, int)");
  }
  if (iVar1 != nInputs) {
    __assert_fail("nVars == nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                  ,0x49b,"word Abc_SopToTruth(char *, int)");
  }
  do {
    Result = Abc_SopToTruth::Truth[7];
    for (nVars = 0; nVars < iVar1; nVars = nVars + 1) {
      if (pSop[local_30] == '1') {
        Result = Abc_SopToTruth::Truth[nVars] & Result;
      }
      else if (pSop[local_30] == '0') {
        Result = (Abc_SopToTruth::Truth[nVars] ^ 0xffffffffffffffff) & Result;
      }
      else if (pSop[local_30] != '-') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                      ,0x4a5,"word Abc_SopToTruth(char *, int)");
      }
      local_30 = local_30 + 1;
    }
    _lit = Result | _lit;
    if (pSop[local_30] != ' ') {
      __assert_fail("pSop[lit] == \' \'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                    ,0x4a8,"word Abc_SopToTruth(char *, int)");
    }
    if (pSop[local_30 + 2] != '\n') {
      __assert_fail("pSop[lit] == \'\\n\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                    ,0x4ab,"word Abc_SopToTruth(char *, int)");
    }
    local_30 = local_30 + 3;
  } while (pSop[local_30] != '\0');
  iVar1 = Abc_SopIsComplement(pSop);
  if (iVar1 != 0) {
    _lit = _lit ^ 0xffffffffffffffff;
  }
  return _lit;
}

Assistant:

word Abc_SopToTruth( char * pSop, int nInputs )
{
    static word Truth[8] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000),
        ABC_CONST(0x0000000000000000),
        ABC_CONST(0xFFFFFFFFFFFFFFFF)
    };
    word Cube, Result = 0;
    int v, lit = 0;
    int nVars = Abc_SopGetVarNum(pSop);
    assert( nVars >= 0 && nVars <= 6 );
    assert( nVars == nInputs );
    do {
        Cube = Truth[7];
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
                Cube &=  Truth[v];
            else if ( pSop[lit] == '0' )
                Cube &= ~Truth[v];
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        Result |= Cube;
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Abc_SopIsComplement(pSop) )
        Result = ~Result;
    return Result;
}